

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O3

void get_range<float>(size_t *ix_arr,float *x,size_t st,size_t end,MissingAction missing_action,
                     double *xmin,double *xmax,bool *unsplittable)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  *xmin = INFINITY;
  *xmax = -INFINITY;
  if (missing_action == Fail) {
    if (end < st) goto LAB_002634ee;
    dVar3 = -INFINITY;
    dVar4 = INFINITY;
    do {
      dVar2 = (double)x[ix_arr[st]];
      dVar5 = dVar2;
      if (dVar4 <= dVar2) {
        dVar5 = dVar4;
      }
      dVar4 = dVar5;
      if (dVar2 <= dVar3) {
        dVar2 = dVar3;
      }
      dVar3 = dVar2;
      st = st + 1;
    } while (st <= end);
LAB_00263538:
    *xmin = dVar4;
    *xmax = dVar3;
    bVar1 = true;
    if ((dVar4 == dVar3) && (!NAN(dVar4) && !NAN(dVar3))) goto LAB_00263582;
  }
  else {
    if (st <= end) {
      dVar4 = INFINITY;
      dVar3 = -INFINITY;
      do {
        dVar5 = (double)x[ix_arr[st]];
        dVar2 = dVar5;
        if (dVar4 <= dVar5) {
          dVar2 = dVar4;
        }
        dVar4 = (double)(~-(ulong)NAN(dVar4) & (ulong)dVar2 | -(ulong)NAN(dVar4) & (ulong)dVar5);
        dVar2 = dVar5;
        if (dVar5 <= dVar3) {
          dVar2 = dVar3;
        }
        dVar3 = (double)(~-(ulong)NAN(dVar3) & (ulong)dVar2 | -(ulong)NAN(dVar3) & (ulong)dVar5);
        st = st + 1;
      } while (st <= end);
      goto LAB_00263538;
    }
LAB_002634ee:
    dVar3 = -INFINITY;
    dVar4 = INFINITY;
  }
  bVar1 = true;
  if (dVar3 != -INFINITY || dVar4 != INFINITY) {
    bVar1 = NAN(dVar3);
  }
LAB_00263582:
  *unsplittable = bVar1;
  return;
}

Assistant:

void get_range(size_t ix_arr[], real_t *restrict x, size_t st, size_t end,
               MissingAction missing_action, double &restrict xmin, double &restrict xmax, bool &unsplittable) noexcept
{
    xmin =  HUGE_VAL;
    xmax = -HUGE_VAL;
    double xval;

    if (missing_action == Fail)
    {
        for (size_t row = st; row <= end; row++)
        {
            xval = x[ix_arr[row]];
            xmin = (xval < xmin)? xval : xmin;
            xmax = (xval > xmax)? xval : xmax;
        }
    }


    else
    {
        for (size_t row = st; row <= end; row++)
        {
            xval = x[ix_arr[row]];
            xmin = std::fmin(xmin, xval);
            xmax = std::fmax(xmax, xval);
        }
    }

    unsplittable = (xmin == xmax) || (xmin == HUGE_VAL && xmax == -HUGE_VAL) || std::isnan(xmin) || std::isnan(xmax);
}